

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

string * __thiscall
cmCTestSVN::SVNInfo::BuildLocalPath(string *__return_storage_ptr__,SVNInfo *this,string *path)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  char *__s1;
  char *__s2;
  size_t __n;
  long lVar4;
  long lVar5;
  string *path_local;
  SVNInfo *this_local;
  string *local_path;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)this);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < uVar2) {
    __s1 = (char *)std::__cxx11::string::c_str();
    __s2 = (char *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    iVar1 = strncmp(__s1,__s2,__n);
    if (iVar1 == 0) {
      lVar4 = std::__cxx11::string::c_str();
      lVar5 = std::__cxx11::string::size();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)(lVar4 + lVar5));
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestSVN::SVNInfo::BuildLocalPath(std::string const& path) const
{
  std::string local_path;

  // Add local path prefix if not empty
  if (!this->LocalPath.empty())
    {
    local_path += this->LocalPath;
    local_path += "/";
    }

  // Add path with base prefix removed
  if(path.size() > this->Base.size() &&
     strncmp(path.c_str(), this->Base.c_str(), this->Base.size()) == 0)
    {
    local_path += (path.c_str() + this->Base.size());
    }
  else
    {
    local_path += path;
  }

  return local_path;
}